

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticPropsCmd.cpp
# Opt level: O2

void cmdline_parser_init(gengetopt_args_info *args_info)

{
  char *pcVar1;
  
  args_info->staticProps_group_counter = 0;
  memset(&args_info->help_given,0,0x1c8);
  args_info->input_arg = (char *)0x0;
  args_info->input_orig = (char *)0x0;
  args_info->output_arg = (char *)0x0;
  args_info->output_orig = (char *)0x0;
  args_info->step_arg = 1;
  args_info->step_orig = (char *)0x0;
  args_info->nbins_arg = 100;
  args_info->nbins_orig = (char *)0x0;
  args_info->nbins_x_arg = 100;
  args_info->nbins_x_orig = (char *)0x0;
  args_info->nbins_y_arg = 100;
  args_info->nbins_y_orig = (char *)0x0;
  args_info->nbins_z_arg = 100;
  args_info->nbins_z_orig = (char *)0x0;
  args_info->nrbins_arg = 100;
  args_info->nrbins_orig = (char *)0x0;
  args_info->binWidth_arg = 1.0;
  args_info->binWidth_orig = (char *)0x0;
  args_info->nanglebins_arg = 0x32;
  args_info->nanglebins_orig = (char *)0x0;
  args_info->rcut_orig = (char *)0x0;
  args_info->OOcut_arg = 3.5;
  args_info->OOcut_orig = (char *)0x0;
  args_info->thetacut_arg = 30.0;
  args_info->thetacut_orig = (char *)0x0;
  args_info->OHcut_arg = 2.45;
  args_info->OHcut_orig = (char *)0x0;
  args_info->dz_orig = (char *)0x0;
  args_info->length_orig = (char *)0x0;
  args_info->zlength_orig = (char *)0x0;
  args_info->seleoffset_orig = (char *)0x0;
  args_info->seleoffset2_orig = (char *)0x0;
  args_info->begin_orig = (char *)0x0;
  args_info->end_orig = (char *)0x0;
  args_info->radius_orig = (char *)0x0;
  args_info->voxelSize_orig = (char *)0x0;
  args_info->gaussWidth_orig = (char *)0x0;
  args_info->zoffset_arg = 0.0;
  args_info->zoffset_orig = (char *)0x0;
  args_info->sele1_arg = (char *)0x0;
  args_info->sele1_orig = (char *)0x0;
  args_info->sele2_arg = (char *)0x0;
  args_info->sele2_orig = (char *)0x0;
  args_info->sele3_arg = (char *)0x0;
  args_info->sele3_orig = (char *)0x0;
  args_info->refsele_arg = (char *)0x0;
  args_info->refsele_orig = (char *)0x0;
  args_info->comsele_arg = (char *)0x0;
  args_info->comsele_orig = (char *)0x0;
  args_info->molname_arg = (char *)0x0;
  args_info->molname_orig = (char *)0x0;
  args_info->privilegedAxis_arg = privilegedAxis_arg_z;
  args_info->privilegedAxis_orig = (char *)0x0;
  args_info->privilegedAxis2_arg = privilegedAxis2_arg_x;
  args_info->privilegedAxis2_orig = (char *)0x0;
  args_info->momentum_arg = momentum_arg_P;
  args_info->momentum_orig = (char *)0x0;
  args_info->component_arg = component_arg_z;
  args_info->component_orig = (char *)0x0;
  args_info->dipoleX_orig = (char *)0x0;
  args_info->dipoleY_orig = (char *)0x0;
  args_info->dipoleZ_orig = (char *)0x0;
  args_info->v_radius_orig = (char *)0x0;
  args_info->gen_xyz_flag = 0;
  args_info->atom_name_arg = (char *)0x0;
  args_info->atom_name_orig = (char *)0x0;
  args_info->help_help = gengetopt_args_info_help[0];
  args_info->version_help = gengetopt_args_info_help[1];
  args_info->input_help = gengetopt_args_info_help[2];
  args_info->output_help = gengetopt_args_info_help[3];
  args_info->step_help = gengetopt_args_info_help[4];
  args_info->nbins_help = gengetopt_args_info_help[5];
  args_info->nbins_x_help = gengetopt_args_info_help[6];
  args_info->nbins_y_help = gengetopt_args_info_help[7];
  args_info->nbins_z_help = gengetopt_args_info_help[8];
  args_info->nrbins_help = gengetopt_args_info_help[9];
  args_info->binWidth_help = gengetopt_args_info_help[10];
  args_info->nanglebins_help = gengetopt_args_info_help[0xb];
  args_info->rcut_help = gengetopt_args_info_help[0xc];
  args_info->OOcut_help = gengetopt_args_info_help[0xd];
  args_info->thetacut_help = gengetopt_args_info_help[0xe];
  args_info->OHcut_help = gengetopt_args_info_help[0xf];
  args_info->dz_help = gengetopt_args_info_help[0x10];
  args_info->length_help = gengetopt_args_info_help[0x11];
  args_info->zlength_help = gengetopt_args_info_help[0x12];
  args_info->zoffset_help = gengetopt_args_info_help[0x13];
  args_info->sele1_help = gengetopt_args_info_help[0x14];
  args_info->sele2_help = gengetopt_args_info_help[0x15];
  args_info->sele3_help = gengetopt_args_info_help[0x16];
  args_info->refsele_help = gengetopt_args_info_help[0x17];
  args_info->comsele_help = gengetopt_args_info_help[0x18];
  args_info->seleoffset_help = gengetopt_args_info_help[0x19];
  args_info->seleoffset2_help = gengetopt_args_info_help[0x1a];
  args_info->molname_help = gengetopt_args_info_help[0x1b];
  args_info->begin_help = gengetopt_args_info_help[0x1c];
  args_info->end_help = gengetopt_args_info_help[0x1d];
  args_info->radius_help = gengetopt_args_info_help[0x1e];
  args_info->voxelSize_help = gengetopt_args_info_help[0x1f];
  args_info->gaussWidth_help = gengetopt_args_info_help[0x20];
  args_info->privilegedAxis_help = gengetopt_args_info_help[0x21];
  args_info->privilegedAxis2_help = gengetopt_args_info_help[0x22];
  args_info->momentum_help = gengetopt_args_info_help[0x23];
  args_info->component_help = gengetopt_args_info_help[0x24];
  args_info->dipoleX_help = gengetopt_args_info_help[0x25];
  args_info->dipoleY_help = gengetopt_args_info_help[0x26];
  args_info->dipoleZ_help = gengetopt_args_info_help[0x27];
  args_info->v_radius_help = gengetopt_args_info_help[0x28];
  args_info->gen_xyz_help = gengetopt_args_info_help[0x29];
  args_info->atom_name_help = gengetopt_args_info_help[0x2a];
  pcVar1 = gengetopt_args_info_help[0x2d];
  args_info->bo_help = gengetopt_args_info_help[0x2c];
  args_info->ior_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x2f];
  args_info->for_help = gengetopt_args_info_help[0x2e];
  args_info->bad_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x31];
  args_info->count_help = gengetopt_args_info_help[0x30];
  args_info->mcount_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x33];
  args_info->gofr_help = gengetopt_args_info_help[0x32];
  args_info->gofz_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x35];
  args_info->r_theta_help = gengetopt_args_info_help[0x34];
  args_info->r_omega_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x37];
  args_info->r_z_help = gengetopt_args_info_help[0x36];
  args_info->theta_omega_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x39];
  args_info->r_theta_omega_help = gengetopt_args_info_help[0x38];
  args_info->gxyz_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x3b];
  args_info->twodgofr_help = gengetopt_args_info_help[0x3a];
  args_info->kirkwood_buff_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x3d];
  args_info->p2_help = gengetopt_args_info_help[0x3c];
  args_info->p2r_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x3f];
  args_info->p2z_help = gengetopt_args_info_help[0x3e];
  args_info->rp2_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x41];
  args_info->scd_help = gengetopt_args_info_help[0x40];
  args_info->density_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x43];
  args_info->slab_density_help = gengetopt_args_info_help[0x42];
  args_info->pipe_density_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x45];
  args_info->p_angle_help = gengetopt_args_info_help[0x44];
  args_info->hxy_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x47];
  args_info->rho_r_help = gengetopt_args_info_help[0x46];
  args_info->angle_r_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x49];
  args_info->hullvol_help = gengetopt_args_info_help[0x48];
  args_info->rodlength_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x4b];
  args_info->tet_param_help = gengetopt_args_info_help[0x4a];
  args_info->tet_param_z_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x4d];
  args_info->tet_param_r_help = gengetopt_args_info_help[0x4c];
  args_info->tet_param_dens_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x4f];
  args_info->tet_param_xyz_help = gengetopt_args_info_help[0x4e];
  args_info->trans_param_z_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x51];
  args_info->rnemdz_help = gengetopt_args_info_help[0x50];
  args_info->rnemdr_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x53];
  args_info->rnemdrt_help = gengetopt_args_info_help[0x52];
  args_info->nitrile_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x55];
  args_info->multipole_help = gengetopt_args_info_help[0x54];
  args_info->surfDiffusion_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x57];
  args_info->cn_help = gengetopt_args_info_help[0x56];
  args_info->scn_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x59];
  args_info->gcn_help = gengetopt_args_info_help[0x58];
  args_info->hbond_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x5b];
  args_info->hbondz_help = gengetopt_args_info_help[0x5a];
  args_info->hbondzvol_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x5d];
  args_info->hbondr_help = gengetopt_args_info_help[0x5c];
  args_info->hbondrvol_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x5f];
  args_info->potDiff_help = gengetopt_args_info_help[0x5e];
  args_info->tet_hb_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x61];
  args_info->kirkwood_help = gengetopt_args_info_help[0x60];
  args_info->kirkwoodQ_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[99];
  args_info->densityfield_help = gengetopt_args_info_help[0x62];
  args_info->velocityfield_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x65];
  args_info->velocityZ_help = gengetopt_args_info_help[100];
  args_info->eam_density_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x67];
  args_info->net_charge_help = gengetopt_args_info_help[0x66];
  args_info->current_density_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x69];
  args_info->chargez_help = gengetopt_args_info_help[0x68];
  args_info->charger_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x6b];
  args_info->massdensityz_help = gengetopt_args_info_help[0x6a];
  args_info->massdensityr_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x6d];
  args_info->numberz_help = gengetopt_args_info_help[0x6c];
  args_info->numberr_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x6f];
  args_info->charge_density_z_help = gengetopt_args_info_help[0x6e];
  args_info->countz_help = pcVar1;
  pcVar1 = gengetopt_args_info_help[0x71];
  args_info->momentum_distribution_help = gengetopt_args_info_help[0x70];
  args_info->dipole_orientation_help = pcVar1;
  args_info->order_prob_help = gengetopt_args_info_help[0x72];
  args_info->inputs = (char **)0x0;
  args_info->inputs_num = 0;
  return;
}

Assistant:

void
cmdline_parser_init (struct gengetopt_args_info *args_info)
{
  clear_given (args_info);
  clear_args (args_info);
  init_args_info (args_info);

  args_info->inputs = 0;
  args_info->inputs_num = 0;
}